

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::ContinuousAssignSymbol::getAssignment(ContinuousAssignSymbol *this)

{
  int iVar1;
  Scope *scope_00;
  ExpressionSyntax *pEVar2;
  undefined4 extraout_var;
  LookupLocation LVar3;
  bitmask<slang::ast::ASTFlags> local_90;
  bitmask<slang::ast::ASTFlags> local_88;
  Scope *local_80;
  uint32_t local_78;
  Scope *local_70;
  uint32_t local_68;
  undefined1 local_60 [8];
  ASTContext context;
  SyntaxNode *syntax;
  Scope *scope;
  ContinuousAssignSymbol *this_local;
  
  if (this->assign == (Expression *)0x0) {
    scope_00 = Symbol::getParentScope(&this->super_Symbol);
    context.assertionInstance = (AssertionInstanceDetails *)Symbol::getSyntax(&this->super_Symbol);
    if ((scope_00 == (Scope *)0x0) || (context.assertionInstance == (AssertionInstanceDetails *)0x0)
       ) {
      assert::assertFailed
                ("scope && syntax",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,0x1b8,
                 "const Expression &slang::ast::ContinuousAssignSymbol::getAssignment() const");
    }
    LVar3 = LookupLocation::after(&this->super_Symbol);
    local_80 = LVar3.scope;
    local_78 = LVar3.index;
    local_70 = local_80;
    local_68 = local_78;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_88,NonProcedural);
    LVar3.index = local_68;
    LVar3.scope = local_70;
    LVar3._12_4_ = 0;
    ASTContext::ASTContext((ASTContext *)local_60,scope_00,LVar3,local_88);
    pEVar2 = slang::syntax::SyntaxNode::as<slang::syntax::ExpressionSyntax>
                       ((SyntaxNode *)context.assertionInstance);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_90,AssignmentAllowed);
    iVar1 = Expression::bind((int)pEVar2,(sockaddr *)local_60,(socklen_t)local_90.m_bits);
    this->assign = (Expression *)CONCAT44(extraout_var,iVar1);
    this_local = (ContinuousAssignSymbol *)this->assign;
  }
  else {
    this_local = (ContinuousAssignSymbol *)this->assign;
  }
  return (Expression *)this_local;
}

Assistant:

const Expression& ContinuousAssignSymbol::getAssignment() const {
    if (assign)
        return *assign;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    ASSERT(scope && syntax);

    ASTContext context(*scope, LookupLocation::after(*this), ASTFlags::NonProcedural);
    assign = &Expression::bind(syntax->as<ExpressionSyntax>(), context,
                               ASTFlags::AssignmentAllowed);

    return *assign;
}